

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.H
# Opt level: O0

iMultiFab *
amrex::makeFineMask<amrex::IArrayBox>
          (FabArray<amrex::IArrayBox> *cmf,FabArray<amrex::IArrayBox> *fmf,IntVect *cnghost,
          IntVect *ratio,Periodicity *period,int crse_value,int fine_value,LayoutData<int> *has_cf)

{
  DistributionMapping *pDVar1;
  BoxArray *bxs;
  LayoutData<int> *in_RCX;
  FabArrayBase *in_RDX;
  FabArrayBase *in_RSI;
  FabArray<amrex::IArrayBox> *in_RDI;
  CPC *cpc;
  iMultiFab foo;
  iMultiFab *mask;
  value_type val;
  LayoutData<int> *rhs;
  FabArray<amrex::IArrayBox> *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  IntVect *in_stack_fffffffffffffba0;
  BoxArray *in_stack_fffffffffffffba8;
  MFInfo *this;
  DistributionMapping *in_stack_fffffffffffffbb0;
  BoxArray *in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  undefined4 uVar2;
  value_type val_00;
  FabArray<amrex::IArrayBox> *this_00;
  CommMetaData *in_stack_fffffffffffffc60;
  FabArray<amrex::IArrayBox> *in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc77;
  Periodicity *in_stack_fffffffffffffc78;
  IntVect *in_stack_fffffffffffffc80;
  FabArrayBase *in_stack_fffffffffffffc88;
  IntVect *in_stack_fffffffffffffc90;
  FabArrayBase *in_stack_fffffffffffffc98;
  undefined1 local_2c0 [8];
  BATransformer local_2b8 [7];
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  byte local_51;
  LayoutData<int> *local_40;
  FabArrayBase *local_38;
  FabArrayBase *local_30;
  int local_20 [2];
  int local_18;
  IntVect local_c;
  
  local_51 = 0;
  this_00 = in_RDI;
  local_40 = in_RCX;
  local_38 = in_RDX;
  local_30 = in_RSI;
  FabArrayBase::boxArray(in_RSI);
  FabArrayBase::DistributionMap(local_30);
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_68 = 0;
  MFInfo::MFInfo((MFInfo *)0x192e6a4);
  local_90 = 0;
  val = (value_type)((ulong)&local_90 >> 0x20);
  DefaultFabFactory<amrex::IArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::IArrayBox> *)in_stack_fffffffffffffb90);
  val_00 = val;
  iMultiFab::iMultiFab
            ((iMultiFab *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
             in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
             (int)((ulong)in_stack_fffffffffffffba8 >> 0x20),in_stack_fffffffffffffba0,
             (MFInfo *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
             (FabFactory<amrex::IArrayBox> *)in_RDI);
  DefaultFabFactory<amrex::IArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::IArrayBox> *)0x192e6ff);
  MFInfo::~MFInfo((MFInfo *)0x192e70c);
  FabArray<amrex::IArrayBox>::setVal<amrex::IArrayBox,_0>(in_stack_fffffffffffffb90,val);
  FabArrayBase::boxArray(local_38);
  coarsen(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  pDVar1 = FabArrayBase::DistributionMap(local_38);
  local_2b8[0].m_op._12_8_ = 0;
  local_2b8[0].m_op._20_8_ = 0;
  local_2b8[0]._0_8_ = 0;
  local_2b8[0].m_op._4_8_ = 0;
  local_2b8[0].m_op._28_8_ = 0;
  this = (MFInfo *)(local_2c0 + 8);
  MFInfo::MFInfo((MFInfo *)0x192e789);
  uVar2 = 0;
  bxs = (BoxArray *)MFInfo::SetAlloc(this,false);
  local_2c0 = (undefined1  [8])0x0;
  rhs = (LayoutData<int> *)local_2c0;
  DefaultFabFactory<amrex::IArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::IArrayBox> *)in_stack_fffffffffffffb90);
  iMultiFab::iMultiFab
            ((iMultiFab *)in_RDI,bxs,
             (DistributionMapping *)CONCAT44(uVar2,in_stack_fffffffffffffbc0),
             (int)((ulong)pDVar1 >> 0x20),(int)pDVar1,(MFInfo *)rhs,
             (FabFactory<amrex::IArrayBox> *)this_00);
  DefaultFabFactory<amrex::IArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::IArrayBox> *)0x192e7ff);
  MFInfo::~MFInfo((MFInfo *)0x192e80c);
  BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffb90);
  IntVect::IntVect(&local_c,0);
  local_18 = local_c.vect[2];
  local_20[0] = local_c.vect[0];
  local_20[1] = local_c.vect[1];
  FabArrayBase::getCPC
            (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,(bool)in_stack_fffffffffffffc77);
  FabArray<amrex::IArrayBox>::setVal<amrex::IArrayBox,_0>
            (this_00,val_00,(CommMetaData *)in_RDI,(int)((ulong)bxs >> 0x20),(int)bxs);
  FabArray<amrex::IArrayBox>::RecvLayoutMask<amrex::IArrayBox,_0>
            (in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
  LayoutData<int>::operator=(local_40,rhs);
  LayoutData<int>::~LayoutData(local_40);
  local_51 = 1;
  iMultiFab::~iMultiFab((iMultiFab *)0x192e949);
  if ((local_51 & 1) == 0) {
    iMultiFab::~iMultiFab((iMultiFab *)0x192ea0f);
  }
  return (iMultiFab *)in_RDI;
}

Assistant:

iMultiFab
makeFineMask (const FabArray<FAB>& cmf, const FabArray<FAB>& fmf,
              const IntVect& cnghost, const IntVect& ratio,
              Periodicity const& period, int crse_value, int fine_value,
              LayoutData<int>& has_cf)
{
    iMultiFab mask(cmf.boxArray(), cmf.DistributionMap(), 1, cnghost);
    mask.setVal(crse_value);

    iMultiFab foo(amrex::coarsen(fmf.boxArray(),ratio), fmf.DistributionMap(),
                  1, 0, MFInfo().SetAlloc(false));
    const FabArrayBase::CPC& cpc = mask.getCPC(cnghost,foo,IntVect::TheZeroVector(),period);
    mask.setVal(fine_value, cpc, 0, 1);

    has_cf = mask.RecvLayoutMask(cpc);

    return mask;
}